

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>,_true> __thiscall
duckdb::LikeMatcher::CreateLikeMatcher(LikeMatcher *this,string *like_pattern,char escape)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  _Head_base<0UL,_duckdb::LikeMatcher_*,_false> _Var5;
  ulong uVar6;
  long lVar7;
  bool has_end_percentage;
  bool has_start_percentage;
  vector<duckdb::LikeSegment,_true> segments;
  bool local_72;
  bool local_71;
  _Head_base<0UL,_duckdb::LikeMatcher_*,_false> local_70;
  vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_71 = false;
  local_72 = false;
  uVar3 = like_pattern->_M_string_length;
  uVar6 = 0;
  local_70._M_head_impl = this;
  while( true ) {
    lVar4 = 0;
    while( true ) {
      uVar2 = uVar6 + lVar4;
      if (uVar3 <= uVar2) {
        if (uVar6 < uVar3) {
          ::std::__cxx11::string::substr((ulong)&local_50,(ulong)like_pattern);
          ::std::vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>>::
          emplace_back<std::__cxx11::string>
                    ((vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>> *)&local_68,
                     &local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        _Var5._M_head_impl = local_70._M_head_impl;
        if (local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_68.super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_018566c3;
        make_uniq<duckdb::LikeMatcher,std::__cxx11::string,duckdb::vector<duckdb::LikeSegment,true>,bool&,bool&>
                  ((duckdb *)local_70._M_head_impl,like_pattern,
                   (vector<duckdb::LikeSegment,_true> *)&local_68,&local_71,&local_72);
        goto LAB_018566cc;
      }
      cVar1 = (like_pattern->_M_dataplus)._M_p[lVar4 + uVar6];
      if (((cVar1 == escape) || (cVar1 == '%')) || (cVar1 == '_')) break;
      lVar4 = lVar4 + 1;
    }
    if (uVar6 < uVar2) {
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)like_pattern);
      ::std::vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>>::
      emplace_back<std::__cxx11::string>
                ((vector<duckdb::LikeSegment,std::allocator<duckdb::LikeSegment>> *)&local_68,
                 &local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    if ((cVar1 == escape) || (cVar1 == '_')) break;
    if (uVar2 == 0) {
      local_71 = true;
    }
    uVar2 = uVar6 + lVar4 + 1;
    lVar7 = uVar6 - like_pattern->_M_string_length;
    uVar3 = like_pattern->_M_string_length;
    uVar6 = uVar2;
    if (lVar7 + lVar4 == -1) {
      local_72 = true;
      uVar3 = uVar2;
    }
  }
LAB_018566c3:
  ((local_70._M_head_impl)->super_FunctionData)._vptr_FunctionData = (_func_int **)0x0;
  _Var5._M_head_impl = local_70._M_head_impl;
LAB_018566cc:
  ::std::vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>::~vector(&local_68);
  return (unique_ptr<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>_>)
         (__uniq_ptr_impl<duckdb::LikeMatcher,_std::default_delete<duckdb::LikeMatcher>_>)
         _Var5._M_head_impl;
}

Assistant:

static unique_ptr<LikeMatcher> CreateLikeMatcher(string like_pattern, char escape = '\0') {
		vector<LikeSegment> segments;
		idx_t last_non_pattern = 0;
		bool has_start_percentage = false;
		bool has_end_percentage = false;
		for (idx_t i = 0; i < like_pattern.size(); i++) {
			auto ch = like_pattern[i];
			if (ch == escape || ch == '%' || ch == '_') {
				// special character, push a constant pattern
				if (i > last_non_pattern) {
					segments.emplace_back(like_pattern.substr(last_non_pattern, i - last_non_pattern));
				}
				last_non_pattern = i + 1;
				if (ch == escape || ch == '_') {
					// escape or underscore: could not create efficient like matcher
					// FIXME: we could handle escaped percentages here
					return nullptr;
				} else {
					// sample_size
					if (i == 0) {
						has_start_percentage = true;
					}
					if (i + 1 == like_pattern.size()) {
						has_end_percentage = true;
					}
				}
			}
		}
		if (last_non_pattern < like_pattern.size()) {
			segments.emplace_back(like_pattern.substr(last_non_pattern, like_pattern.size() - last_non_pattern));
		}
		if (segments.empty()) {
			return nullptr;
		}
		return make_uniq<LikeMatcher>(std::move(like_pattern), std::move(segments), has_start_percentage,
		                              has_end_percentage);
	}